

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mip_level::pack_to_dxt(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  bool bVar1;
  int iVar2;
  image_u8 *img;
  image_u8 tmp_img;
  
  iVar2 = pixel_format_helpers::is_dxt(fmt);
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    tmp_img.m_width = 0;
    tmp_img.m_height = 0;
    tmp_img.m_pitch = 0;
    tmp_img.m_total = 0;
    tmp_img.m_comp_flags = 0xf;
    tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
    tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
    tmp_img.m_pixel_buf.m_size = 0;
    tmp_img.m_pixel_buf.m_capacity = 0;
    img = get_unpacked_image(this,&tmp_img,1);
    bVar1 = pack_to_dxt(this,img,fmt,cook,p,this->m_orient_flags);
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp_img.m_pixel_buf);
  }
  return bVar1;
}

Assistant:

bool mip_level::pack_to_dxt(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  image_u8 tmp_img;
  image_u8* pImage = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  return pack_to_dxt(*pImage, fmt, cook, p, m_orient_flags);
}